

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

bcf_hrec_t * bcf_hrec_dup(bcf_hrec_t *hrec)

{
  uint uVar1;
  int iVar2;
  bcf_hrec_t *pbVar3;
  char *pcVar4;
  char **ppcVar5;
  char **ppcVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  
  pbVar3 = (bcf_hrec_t *)calloc(1,0x30);
  pbVar3->type = hrec->type;
  if (hrec->key != (char *)0x0) {
    pcVar4 = strdup(hrec->key);
    pbVar3->key = pcVar4;
  }
  if (hrec->value != (char *)0x0) {
    pcVar4 = strdup(hrec->value);
    pbVar3->value = pcVar4;
  }
  uVar1 = hrec->nkeys;
  pbVar3->nkeys = uVar1;
  ppcVar5 = (char **)malloc((long)(int)uVar1 << 3);
  pbVar3->keys = ppcVar5;
  ppcVar6 = (char **)malloc((long)(int)uVar1 << 3);
  pbVar3->vals = ppcVar6;
  uVar9 = 0;
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar8 = 0;
  do {
    if (uVar7 == uVar9) {
      if ((int)uVar7 != iVar8) {
        pbVar3->nkeys = (uVar1 - (int)uVar7) + iVar8;
      }
      return pbVar3;
    }
    pcVar4 = hrec->keys[uVar9];
    if (pcVar4 == (char *)0x0) {
LAB_00114b53:
      if (hrec->vals[uVar9] != (char *)0x0) {
        pcVar4 = strdup(hrec->vals[uVar9]);
        ppcVar6[iVar8] = pcVar4;
      }
      iVar8 = iVar8 + 1;
    }
    else {
      iVar2 = strcmp("IDX",pcVar4);
      if (iVar2 != 0) {
        pcVar4 = strdup(pcVar4);
        ppcVar5[iVar8] = pcVar4;
        goto LAB_00114b53;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bcf_hrec_t *bcf_hrec_dup(bcf_hrec_t *hrec)
{
    bcf_hrec_t *out = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    out->type = hrec->type;
    if ( hrec->key ) out->key = strdup(hrec->key);
    if ( hrec->value ) out->value = strdup(hrec->value);
    out->nkeys = hrec->nkeys;
    out->keys = (char**) malloc(sizeof(char*)*hrec->nkeys);
    out->vals = (char**) malloc(sizeof(char*)*hrec->nkeys);
    int i, j = 0;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( hrec->keys[i] && !strcmp("IDX",hrec->keys[i]) ) continue;
        if ( hrec->keys[i] ) out->keys[j] = strdup(hrec->keys[i]);
        if ( hrec->vals[i] ) out->vals[j] = strdup(hrec->vals[i]);
        j++;
    }
    if ( i!=j ) out->nkeys -= i-j;   // IDX was omitted
    return out;
}